

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yabmpconvert_topng.c
# Opt level: O0

int convert_topng(yabmpconvert_parameters *parameters,yabmp *bmp_reader,yabmp_info *bmp_info)

{
  int iVar1;
  __jmp_buf_tag *__env;
  ulong uVar2;
  ulong in_stack_fffffffffffffb80;
  void *local_468;
  void *local_460;
  undefined1 local_444;
  undefined1 local_440;
  undefined1 local_43c;
  undefined1 local_438;
  undefined1 local_434;
  uint local_418;
  uint local_414;
  yabmp_uint32 i_2;
  yabmp_uint32 i_1;
  anon_union_8_2_1e24db1e l_current_row;
  size_t l_check_buffer_size;
  yabmp_q16d16 gb;
  yabmp_q16d16 gg;
  yabmp_q16d16 gr;
  yabmp_cie_xyz b;
  yabmp_cie_xyz g;
  yabmp_cie_xyz r;
  int srgb_intent;
  yabmp_uint32 l_icc_profile_len;
  yabmp_uint8 *l_icc_profile;
  undefined1 local_3b8 [3];
  png_color_8 l_sBIT;
  png_color l_png_palette [256];
  yabmp_color *l_bmp_palette;
  uint l_num_palette;
  uint i;
  FILE *l_output;
  png_infop l_png_info;
  png_structp l_png_writer;
  undefined4 local_88;
  int l_need_full_image;
  uint l_color_profile_intent;
  uint l_color_profile_type;
  uint alpha_bits;
  uint red_bits;
  uint green_bits;
  uint blue_bits;
  int l_png_has_sBIT;
  yabmp_uint32 l_png_color_mask;
  uint l_scan_direction;
  yabmp_uint32 l_compression_type;
  uint l_color_type;
  uint l_bit_depth;
  yabmp_uint32 l_res_y;
  yabmp_uint32 l_res_x;
  yabmp_uint32 l_height;
  yabmp_uint32 l_width;
  size_t l_buffer_size;
  void *l_buffer_cache;
  void *l_buffer;
  yabmp_info *pyStack_28;
  int result;
  yabmp_info *bmp_info_local;
  yabmp *bmp_reader_local;
  yabmpconvert_parameters *parameters_local;
  
  l_buffer._4_4_ = 1;
  l_buffer_cache = (void *)0x0;
  green_bits = 0;
  l_png_writer._4_4_ = 0;
  l_png_info = (png_infop)0x0;
  l_output = (FILE *)0x0;
  _l_num_palette = (FILE *)0x0;
  pyStack_28 = bmp_info;
  bmp_info_local = (yabmp_info *)bmp_reader;
  bmp_reader_local = (yabmp *)parameters;
  if (parameters == (yabmpconvert_parameters *)0x0) {
    __assert_fail("parameters != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/mayeut[P]yabmp/bin/yabmpconvert/yabmpconvert_topng.c"
                  ,0x79,"int convert_topng(const yabmpconvert_parameters *, yabmp *, yabmp_info *)")
    ;
  }
  if (bmp_reader == (yabmp *)0x0) {
    __assert_fail("bmp_reader != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/mayeut[P]yabmp/bin/yabmpconvert/yabmpconvert_topng.c"
                  ,0x7a,"int convert_topng(const yabmpconvert_parameters *, yabmp *, yabmp_info *)")
    ;
  }
  if (bmp_info == (yabmp_info *)0x0) {
    __assert_fail("bmp_info != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/mayeut[P]yabmp/bin/yabmpconvert/yabmpconvert_topng.c"
                  ,0x7b,"int convert_topng(const yabmpconvert_parameters *, yabmp *, yabmp_info *)")
    ;
  }
  yabmp_get_color_type(bmp_reader,bmp_info,&l_scan_direction);
  yabmp_get_compression_type(bmp_info_local,pyStack_28,&l_png_color_mask);
  yabmp_get_scan_direction(bmp_info_local,pyStack_28,&l_png_has_sBIT);
  yabmp_get_color_profile_type(bmp_info_local,pyStack_28,&l_need_full_image);
  yabmp_get_color_profile_intent(bmp_info_local,pyStack_28,&local_88);
  switch(l_scan_direction) {
  case 1:
    if (((byte)bmp_reader_local[0x20] >> 3 & 1) == 0) {
      if (((byte)bmp_reader_local[0x20] >> 4 & 1) == 0) {
        yabmp_set_expand_to_grayscale(bmp_info_local);
      }
    }
    else {
      yabmp_set_expand_to_bgrx(bmp_info_local);
    }
    break;
  case 2:
    break;
  case 3:
    if (((byte)bmp_reader_local[0x20] >> 3 & 1) != 0) {
      yabmp_set_expand_to_bgrx(bmp_info_local);
    }
    break;
  default:
    if (((byte)bmp_reader_local[0x20] >> 2 & 1) == 0) {
      fprintf(_stderr,"ERROR: Transcoding not supported.\n");
    }
    return 1;
  case 10:
    yabmp_set_expand_to_bgrx(bmp_info_local);
    break;
  case 0xe:
    yabmp_set_expand_to_bgrx(bmp_info_local);
  }
  if (l_png_has_sBIT == 0) {
    if (l_png_color_mask == 0) {
      if (((byte)bmp_reader_local[0x20] >> 5 & 1) == 0) {
        iVar1 = yabmp_set_invert_scan_direction(bmp_info_local);
        if (iVar1 != 0) {
          return 1;
        }
      }
      else {
        l_png_writer._4_4_ = 1;
      }
    }
    else {
      l_png_writer._4_4_ = 1;
    }
  }
  yabmp_read_update_info(bmp_info_local,pyStack_28);
  yabmp_get_color_type(bmp_info_local,pyStack_28,&l_scan_direction);
  yabmp_get_dimensions(bmp_info_local,pyStack_28,&l_res_x,&l_res_y);
  yabmp_get_pixels_per_meter(bmp_info_local,pyStack_28,&l_bit_depth,&l_color_type);
  yabmp_get_bit_depth(bmp_info_local,pyStack_28,&l_compression_type);
  yabmp_get_bits(bmp_info_local,pyStack_28,&red_bits,&alpha_bits,&l_color_profile_type,
                 &l_color_profile_intent);
  switch(l_scan_direction) {
  case 0:
    blue_bits = 0;
    break;
  case 1:
  case 3:
    blue_bits = 3;
    break;
  case 2:
    blue_bits = 2;
    break;
  default:
    if (((byte)bmp_reader_local[0x20] >> 2 & 1) == 0) {
      fprintf(_stderr,"ERROR: Transcoding not supported.\n");
    }
    return 1;
  case 6:
    blue_bits = 6;
  }
  if ((((red_bits != l_compression_type) || (alpha_bits != l_compression_type)) ||
      (l_color_profile_type != l_compression_type)) ||
     ((l_color_profile_intent != l_compression_type && (l_color_profile_intent != 0)))) {
    green_bits = 1;
  }
  if ((**(char **)(bmp_reader_local + 8) == '-') &&
     (*(char *)(*(long *)(bmp_reader_local + 8) + 1) == '\0')) {
    stream_setmode_binary((FILE *)_stdout,(uint)((byte)bmp_reader_local[0x20] >> 2 & 1));
    _l_num_palette = _stdout;
  }
  else {
    _l_num_palette = fopen(*(char **)(bmp_reader_local + 8),"wb");
    if (_l_num_palette == (FILE *)0x0) {
      if (((byte)bmp_reader_local[0x20] >> 2 & 1) == 0) {
        fprintf(_stderr,"ERROR: can\'t open file %s for writing\n",
                *(undefined8 *)(bmp_reader_local + 8));
      }
      return 1;
    }
  }
  uVar2 = 0;
  l_png_info = (png_infop)
               png_create_write_struct_2
                         ("1.6.37",0,print_png_error,print_png_warning,bmp_reader_local,
                          custom_png_malloc,custom_png_free);
  if (l_png_info == (png_infop)0x0) {
    if (((byte)bmp_reader_local[0x20] >> 2 & 1) == 0) {
      fprintf(_stderr,"ERROR: can\'t create PNG struct\n");
    }
  }
  else {
    __env = (__jmp_buf_tag *)png_set_longjmp_fn(l_png_info,longjmp,200);
    iVar1 = _setjmp(__env);
    if (iVar1 == 0) {
      png_init_io(l_png_info,_l_num_palette);
      l_output = (FILE *)png_create_info_struct(l_png_info);
      if (l_output == (FILE *)0x0) {
        if (((byte)bmp_reader_local[0x20] >> 2 & 1) == 0) {
          fprintf(_stderr,"ERROR: can\'t create PNG info struct\n");
        }
      }
      else {
        png_set_IHDR(l_png_info,l_output,l_res_x,l_res_y,l_compression_type,blue_bits,
                     uVar2 & 0xffffffff00000000,in_stack_fffffffffffffb80 & 0xffffffff00000000,0);
        if ((l_bit_depth != 0) || (l_color_type != 0)) {
          png_set_pHYs(l_png_info,l_output,l_bit_depth,l_color_type,1);
        }
        if (blue_bits == 3) {
          iVar1 = yabmp_get_palette(bmp_info_local,pyStack_28,&l_bmp_palette,
                                    &l_png_palette[0xfd].green);
          if (iVar1 != 0) goto LAB_00103dc1;
          if (0x100 < (uint)l_bmp_palette) {
            __assert_fail("l_num_palette <= 256U",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/mayeut[P]yabmp/bin/yabmpconvert/yabmpconvert_topng.c"
                          ,0x111,
                          "int convert_topng(const yabmpconvert_parameters *, yabmp *, yabmp_info *)"
                         );
          }
          for (l_bmp_palette._4_4_ = 0; l_bmp_palette._4_4_ < (uint)l_bmp_palette;
              l_bmp_palette._4_4_ = l_bmp_palette._4_4_ + 1) {
            local_3b8[(ulong)l_bmp_palette._4_4_ * 3 + 2] =
                 *(undefined1 *)(l_png_palette._760_8_ + (ulong)l_bmp_palette._4_4_ * 3 + 2);
            local_3b8[(ulong)l_bmp_palette._4_4_ * 3 + 1] =
                 *(undefined1 *)(l_png_palette._760_8_ + (ulong)l_bmp_palette._4_4_ * 3 + 1);
            local_3b8[(ulong)l_bmp_palette._4_4_ * 3] =
                 *(undefined1 *)(l_png_palette._760_8_ + (ulong)l_bmp_palette._4_4_ * 3);
          }
          png_set_PLTE(l_png_info,l_output,local_3b8);
        }
        if ((green_bits != 0) && ((blue_bits & 0xfffffffb) == 2)) {
          l_icc_profile._7_1_ = (undefined1)l_color_profile_intent;
          l_icc_profile._6_1_ = 0;
          if (red_bits == 0) {
            local_434 = 1;
          }
          else {
            local_434 = (undefined1)red_bits;
          }
          l_icc_profile._5_1_ = local_434;
          if (alpha_bits == 0) {
            local_438 = 1;
          }
          else {
            local_438 = (undefined1)alpha_bits;
          }
          l_icc_profile._4_1_ = local_438;
          if (l_color_profile_type == 0) {
            local_43c = 1;
          }
          else {
            local_43c = (undefined1)l_color_profile_type;
          }
          l_icc_profile._3_1_ = local_43c;
          png_set_sBIT(l_png_info,l_output,(long)&l_icc_profile + 3);
          if (l_color_profile_type == 0) {
            local_440 = 1;
          }
          else {
            local_440 = (undefined1)l_color_profile_type;
          }
          l_icc_profile._5_1_ = local_440;
          if (red_bits == 0) {
            local_444 = 1;
          }
          else {
            local_444 = (undefined1)red_bits;
          }
          l_icc_profile._3_1_ = local_444;
          png_set_shift(l_png_info,(long)&l_icc_profile + 3);
        }
        if (l_need_full_image == 1) {
          switch(local_88) {
          case 0:
          case 1:
            r.y = 0;
            break;
          case 2:
            r.y = 1;
            break;
          case 3:
            r.y = 2;
            break;
          case 4:
            r.y = 3;
            break;
          default:
            if (((byte)bmp_reader_local[0x20] >> 2 & 1) == 0) {
              fprintf(_stderr,"ERROR: invalid intent\n");
            }
            goto LAB_00103dc1;
          }
          png_set_sRGB(l_png_info,l_output,r.y);
        }
        else if (l_need_full_image == 3) {
          _srgb_intent = 0;
          yabmp_get_color_profile_icc_data(bmp_info_local,pyStack_28,&srgb_intent);
          png_set_iCCP(l_png_info,l_output,"bmpiccprofile",0,_srgb_intent,r.z);
        }
        else if (l_need_full_image == 4) {
          yabmp_get_color_profile_calibration
                    (bmp_info_local,pyStack_28,&g.y,&b.y,&gg,&gb,(long)&l_check_buffer_size + 4,
                     &l_check_buffer_size);
          png_set_cHRM_XYZ((double)g.y * 9.313225754828403e-10,(double)g.z * 9.313225754828403e-10,
                           (double)r.x * 9.313225754828403e-10,(double)b.y * 9.313225754828403e-10,
                           (double)b.z * 9.313225754828403e-10,(double)g.x * 9.313225754828403e-10,
                           (double)gg * 9.313225754828403e-10,(double)gr * 9.313225754828403e-10,
                           l_png_info,l_output);
          png_set_gAMA((double)(gb + l_check_buffer_size._4_4_ + (int)l_check_buffer_size) *
                       5.086263020833333e-06,l_png_info,l_output);
        }
        png_write_info(l_png_info,l_output);
        if ((blue_bits | 4) == 6) {
          png_set_bgr(l_png_info);
        }
        if (l_compression_type == 0x10) {
          png_set_swap(l_png_info);
        }
        _l_height = (void *)png_get_rowbytes(l_png_info,l_output);
        yabmp_get_rowbytes(bmp_info_local,pyStack_28,&l_current_row);
        if (l_current_row.buffer == _l_height) {
          if (l_png_writer._4_4_ == 0) {
            if (*(long *)(bmp_reader_local + 0x10) == 0) {
              local_468 = malloc((size_t)_l_height);
            }
            else {
              local_468 = (void *)(**(code **)(bmp_reader_local + 0x10))(0,_l_height);
            }
            l_buffer_cache = local_468;
          }
          else {
            if (*(long *)(bmp_reader_local + 0x10) == 0) {
              local_460 = malloc((long)_l_height * (ulong)l_res_y);
            }
            else {
              local_460 = (void *)(**(code **)(bmp_reader_local + 0x10))
                                            (0,(long)_l_height * (ulong)l_res_y);
            }
            l_buffer_cache = local_460;
          }
          l_buffer_size = (size_t)l_buffer_cache;
          if (l_buffer_cache == (void *)0x0) {
            if (((byte)bmp_reader_local[0x20] >> 2 & 1) == 0) {
              fprintf(_stderr,"ERROR: can\'t allocate buffer for 1 line\n");
            }
          }
          else {
            if (l_png_writer._4_4_ == 0) {
              for (local_418 = 0; local_418 < l_res_y; local_418 = local_418 + 1) {
                iVar1 = yabmp_read_row(bmp_info_local,l_buffer_size,_l_height);
                if (iVar1 != 0) goto LAB_00103dc1;
                png_write_row(l_png_info,l_buffer_size);
              }
            }
            else {
              _i_2 = l_buffer_cache;
              for (local_414 = 0; local_414 < l_res_y; local_414 = local_414 + 1) {
                iVar1 = yabmp_read_row(bmp_info_local,_i_2,_l_height);
                if (iVar1 != 0) goto LAB_00103dc1;
                _i_2 = (void *)((long)_l_height + (long)_i_2);
              }
              for (local_414 = 0; local_414 < l_res_y; local_414 = local_414 + 1) {
                _i_2 = (void *)((long)_i_2 - (long)_l_height);
                png_write_row(l_png_info,_i_2);
              }
            }
            if (*(long *)(bmp_reader_local + 0x18) == 0) {
              free((void *)l_buffer_size);
            }
            else {
              (**(code **)(bmp_reader_local + 0x18))(0,l_buffer_size);
            }
            l_buffer_cache = (void *)0x0;
            png_write_end(l_png_info,0);
            l_buffer._4_4_ = 0;
          }
        }
        else if (((byte)bmp_reader_local[0x20] >> 2 & 1) == 0) {
          fprintf(_stderr,"ERROR: row bytes not matching between YABMP & PNG\n");
        }
      }
    }
  }
LAB_00103dc1:
  if (l_png_info != (png_infop)0x0) {
    png_destroy_write_struct(&l_png_info,&l_output);
  }
  if (((_l_num_palette != (FILE *)0x0) && (_l_num_palette != _stdout)) &&
     (fclose(_l_num_palette), l_buffer._4_4_ != 0)) {
    remove(*(char **)(bmp_reader_local + 8));
  }
  l_buffer_size = (size_t)l_buffer_cache;
  if (l_buffer_cache != (void *)0x0) {
    if (*(long *)(bmp_reader_local + 0x18) == 0) {
      free(l_buffer_cache);
    }
    else {
      (**(code **)(bmp_reader_local + 0x18))(0,l_buffer_cache);
    }
  }
  return l_buffer._4_4_;
}

Assistant:

int convert_topng(const yabmpconvert_parameters* parameters, yabmp* bmp_reader, yabmp_info* bmp_info)
{
	int result = EXIT_FAILURE; /* default is fail */
	void* volatile l_buffer = NULL; /* volatile needed because of long jump */
	void* l_buffer_cache;
	size_t l_buffer_size;
	yabmp_uint32 l_width, l_height;
	yabmp_uint32 l_res_x, l_res_y;
	unsigned int l_bit_depth;
	unsigned int l_color_type;
	yabmp_uint32 l_compression_type;
	unsigned int l_scan_direction;
	yabmp_uint32 l_png_color_mask;
	int l_png_has_sBIT = 0;
	unsigned int blue_bits, green_bits, red_bits, alpha_bits;
	unsigned int l_color_profile_type, l_color_profile_intent;
	int l_need_full_image = 0;
		
	png_structp l_png_writer = NULL;
	png_infop l_png_info = NULL;
	FILE* l_output = NULL;
	
	assert(parameters != NULL);
	assert(bmp_reader != NULL);
	assert(bmp_info != NULL);
	
	/* Those calls can't fail with proper arguments */
	(void)yabmp_get_color_type(bmp_reader, bmp_info, &l_color_type);
	(void)yabmp_get_compression_type(bmp_reader, bmp_info, &l_compression_type);
	(void)yabmp_get_scan_direction(bmp_reader, bmp_info, &l_scan_direction);
	(void)yabmp_get_color_profile_type(bmp_reader, bmp_info, &l_color_profile_type);
	(void)yabmp_get_color_profile_intent(bmp_reader, bmp_info, &l_color_profile_intent);
	
	/* Check transforms needed */
	switch (l_color_type)
	{
		case YABMP_COLOR_TYPE_BGR:
			break;
		case YABMP_COLOR_TYPE_BITFIELDS:
			yabmp_set_expand_to_bgrx(bmp_reader); /* always expand to BGR(A) */
			break;
		case YABMP_COLOR_TYPE_BITFIELDS_ALPHA:
			yabmp_set_expand_to_bgrx(bmp_reader); /* always expand to BGR(A) */
			break;
		case YABMP_COLOR_TYPE_PALETTE:
			if (parameters->expand_palette) {
				yabmp_set_expand_to_bgrx(bmp_reader); /* expand to BGR(A) */
			}
			break;
		case YABMP_COLOR_TYPE_GRAY_PALETTE:
			if (parameters->expand_palette) {
				yabmp_set_expand_to_bgrx(bmp_reader); /* always expand to BGR(A) */
			} else if (parameters->keep_gray_palette) {
				/* Nothing to do */
			} else {
				yabmp_set_expand_to_grayscale(bmp_reader); /* always expand to Y8 */
			}
			break;
		default:
			if (!parameters->quiet) {
				fprintf(stderr, "ERROR: Transcoding not supported.\n");
			}
			return EXIT_FAILURE;
	}
	switch (l_scan_direction)
	{
		case YABMP_SCAN_BOTTOM_UP:
			switch (l_compression_type) {
				case YABMP_COMPRESSION_NONE:
					if (parameters->no_seek_fn) {
						/* no seek for stdin */
						l_need_full_image = 1;
					} else {
						if (yabmp_set_invert_scan_direction(bmp_reader) != YABMP_OK) {
							return EXIT_FAILURE;
						}
					}
					break;
				default:
					l_need_full_image = 1;
					break;
			}
			break;
		default:
		case YABMP_SCAN_TOP_DOWN:
			break;
	}
	/* Update infos & set PNG parameters */
	yabmp_read_update_info(bmp_reader, bmp_info);
	
	(void)yabmp_get_color_type(bmp_reader, bmp_info, &l_color_type);
	(void)yabmp_get_dimensions(bmp_reader, bmp_info, &l_width, &l_height);
	(void)yabmp_get_pixels_per_meter(bmp_reader, bmp_info, &l_res_x, &l_res_y);
	(void)yabmp_get_bit_depth(bmp_reader, bmp_info, &l_bit_depth);
	(void)yabmp_get_bits(bmp_reader, bmp_info, &blue_bits, &green_bits, &red_bits, &alpha_bits);
	
	switch (l_color_type)
	{
		case YABMP_COLOR_TYPE_BGR:
			l_png_color_mask = PNG_COLOR_TYPE_RGB;
			break;
		case YABMP_COLOR_TYPE_BGR_ALPHA:
			l_png_color_mask = PNG_COLOR_TYPE_RGB_ALPHA;
			break;
		case YABMP_COLOR_TYPE_PALETTE:
		case YABMP_COLOR_TYPE_GRAY_PALETTE:
				l_png_color_mask = PNG_COLOR_TYPE_PALETTE;
			break;
		case YABMP_COLOR_TYPE_GRAY:
				l_png_color_mask = PNG_COLOR_TYPE_GRAY;
			break;
		default:
			if (!parameters->quiet) {
				fprintf(stderr, "ERROR: Transcoding not supported.\n");
			}
			return EXIT_FAILURE;
	}
	
	if (
			(blue_bits != l_bit_depth) ||
			(green_bits != l_bit_depth) ||
			(red_bits != l_bit_depth) ||
			((alpha_bits != l_bit_depth) && (alpha_bits != 0))) {
		l_png_has_sBIT = 1;
	}
	
	if ((parameters->output_file[0] == '-') && (parameters->output_file[1] == '\0')) {
		stream_setmode_binary(stdout, parameters->quiet);
		l_output = stdout;
	}
	else {
		l_output = fopen(parameters->output_file, "wb");
		if (l_output == NULL) {
			if (!parameters->quiet) {
				fprintf(stderr, "ERROR: can't open file %s for writing\n", parameters->output_file);
			}
			return EXIT_FAILURE;
		}
	}
	
	l_png_writer = png_create_write_struct_2(PNG_LIBPNG_VER_STRING, NULL, print_png_error, print_png_warning, (png_voidp)parameters, custom_png_malloc, custom_png_free);
	if (l_png_writer == NULL) {
		if (!parameters->quiet) {
			fprintf(stderr, "ERROR: can't create PNG struct\n");
		}
		goto BADEND;
	}
	if (setjmp(png_jmpbuf(l_png_writer))) {
		goto BADEND;
	}
	/* errors here will generate long jump */
	png_init_io(l_png_writer, l_output);
	l_png_info = png_create_info_struct(l_png_writer);
	if (l_png_info == NULL) {
		if (!parameters->quiet) {
			fprintf(stderr, "ERROR: can't create PNG info struct\n");
		}
		goto BADEND;
	}
		
	png_set_IHDR(l_png_writer, l_png_info, l_width, l_height, (int)l_bit_depth, l_png_color_mask, PNG_INTERLACE_NONE, PNG_COMPRESSION_TYPE_DEFAULT, PNG_FILTER_TYPE_DEFAULT);
	
	if ((l_res_x != 0U) || (l_res_y != 0U)) {
		png_set_pHYs(l_png_writer, l_png_info, l_res_x, l_res_y, PNG_RESOLUTION_METER);
	}
	
	if (l_png_color_mask == PNG_COLOR_TYPE_PALETTE) {
		unsigned int i, l_num_palette;
		const yabmp_color *l_bmp_palette;
		png_color l_png_palette[256];
		
		if(yabmp_get_palette(bmp_reader, bmp_info, &l_num_palette, &l_bmp_palette) != YABMP_OK) {
			goto BADEND;
		}
		assert(l_num_palette <= 256U);
		for (i = 0U; i < l_num_palette; ++i) {
			l_png_palette[i].blue  = l_bmp_palette[i].blue;
			l_png_palette[i].green = l_bmp_palette[i].green;
			l_png_palette[i].red   = l_bmp_palette[i].red;
		}
		
		png_set_PLTE(l_png_writer, l_png_info, l_png_palette, (int)l_num_palette);
	}
		
	if (l_png_has_sBIT) {
		png_color_8 l_sBIT;
		
		if ((l_png_color_mask & ~PNG_COLOR_MASK_ALPHA) == PNG_COLOR_TYPE_RGB) {
			l_sBIT.alpha = alpha_bits;
			l_sBIT.gray  = 0U;
			l_sBIT.blue  = blue_bits ? blue_bits : 1; /* 0 is forbidden, transform deadlocks */
			l_sBIT.green = green_bits ? green_bits : 1;
			l_sBIT.red   = red_bits ? red_bits : 1;
			png_set_sBIT(l_png_writer, l_png_info, &l_sBIT);
			
			/* because of png_set_bgr */
			l_sBIT.blue  = red_bits ? red_bits : 1;
			l_sBIT.red   = blue_bits ? blue_bits : 1;
			png_set_shift(l_png_writer, &l_sBIT);
		}
	}
	
	switch (l_color_profile_type) {
		case YABMP_COLOR_PROFILE_ICC_EMBEDDED:
			{
				yabmp_uint8 const* l_icc_profile = NULL;
				yabmp_uint32 l_icc_profile_len;
				(void)yabmp_get_color_profile_icc_data(bmp_reader, bmp_info, &l_icc_profile, &l_icc_profile_len);
				png_set_iCCP(l_png_writer, l_png_info, "bmpiccprofile", 0, l_icc_profile, l_icc_profile_len);
			}
			break;
		case YABMP_COLOR_PROFILE_sRGB:
			{
				int srgb_intent;
				switch (l_color_profile_intent) {
					case YABMP_COLOR_PROFILE_INTENT_NONE:
					case YABMP_COLOR_PROFILE_INTENT_PERCEPTUAL:
						srgb_intent = 0;
						break;
					case YABMP_COLOR_PROFILE_INTENT_RELCOL:
						srgb_intent = 1;
						break;
					case YABMP_COLOR_PROFILE_INTENT_SATURATION:
						srgb_intent = 2;
						break;
					case YABMP_COLOR_PROFILE_INTENT_ABSCOL:
						srgb_intent = 3;
						break;
					default:
						if (!parameters->quiet) {
							fprintf(stderr, "ERROR: invalid intent\n");
						}
						goto BADEND;
						break;
				}
				png_set_sRGB(l_png_writer, l_png_info, srgb_intent);
			}
			break;
		case YABMP_COLOR_PROFILE_CALIBRATED_RGB:
			{
				yabmp_cie_xyz r, g, b;
				yabmp_q16d16 gr, gg, gb;
				(void)yabmp_get_color_profile_calibration(bmp_reader, bmp_info, &r, &g, &b, &gr, &gg, &gb);
				png_set_cHRM_XYZ(l_png_writer, l_png_info, r.x * (1.0 / 1073741823.0), r.y * (1.0 / 1073741823.0), r.z * (1.0 / 1073741823.0), g.x * (1.0 / 1073741823.0), g.y * (1.0 / 1073741823.0), g.z * (1.0 / 1073741823.0), b.x * (1.0 / 1073741823.0), b.y * (1.0 / 1073741823.0), b.z * (1.0 / 1073741823.0));
				/* how to handle per channel gamma ? */
				/* let's just average for now... */
				png_set_gAMA(l_png_writer, l_png_info, (gr + gg + gb) * (1.0 / (3.0 * 65536.0)));
			}
			break;
		default:
			break;
	}
	
	png_write_info(l_png_writer, l_png_info);
		
	switch (l_png_color_mask) {
		case PNG_COLOR_TYPE_RGB:
		case PNG_COLOR_TYPE_RGB_ALPHA:
			png_set_bgr(l_png_writer);
			break;
		default:
			break;
	}
#if !defined(YABMP_BIG_ENDIAN)
	if (l_bit_depth == 16U) {
		png_set_swap(l_png_writer);
	}
#endif
	
	/* Now deal with the image */
	l_buffer_size = png_get_rowbytes(l_png_writer, l_png_info);
	{
		size_t l_check_buffer_size;
		yabmp_get_rowbytes(bmp_reader, bmp_info, &l_check_buffer_size);
		if (l_check_buffer_size != l_buffer_size) {
			if (!parameters->quiet) {
				fprintf(stderr, "ERROR: row bytes not matching between YABMP & PNG\n");
			}
			goto BADEND;
		}
	}
	if (l_need_full_image) {
		/* TODO check overflow */
		l_buffer = l_buffer_cache = parameters->malloc ? parameters->malloc(NULL, l_buffer_size * (size_t)l_height) : malloc(l_buffer_size * (size_t)l_height);
	}
	else {
		l_buffer = l_buffer_cache = parameters->malloc ? parameters->malloc(NULL, l_buffer_size): malloc(l_buffer_size);
	}
	if (l_buffer_cache == NULL) {
		if (!parameters->quiet) {
			fprintf(stderr, "ERROR: can't allocate buffer for 1 line\n");
		}
		goto BADEND;
	}
	if (l_need_full_image) {
		union
		{
			void* buffer;
			yabmp_uint8* buffer8u;
		} l_current_row;
		yabmp_uint32 i;
		
		l_current_row.buffer = l_buffer_cache;
		for (i = 0U; i < l_height; ++i) {
			if (yabmp_read_row(bmp_reader, l_current_row.buffer, l_buffer_size) != YABMP_OK) {
				goto BADEND;
			}
			l_current_row.buffer8u += l_buffer_size;
		}
		for (i = 0U; i < l_height; ++i) {
			l_current_row.buffer8u -= l_buffer_size;
			png_write_row(l_png_writer, l_current_row.buffer);
		}
	}
	else {
		yabmp_uint32 i;
		for (i = 0U; i < l_height; ++i) {
			if (yabmp_read_row(bmp_reader, l_buffer_cache, l_buffer_size) != YABMP_OK) {
				goto BADEND;
			}
			png_write_row(l_png_writer, l_buffer_cache);
		}
	}
	parameters->free ? parameters->free(NULL, l_buffer_cache) : free(l_buffer_cache);
	l_buffer = NULL;
		
	png_write_end(l_png_writer, NULL);
	result = 0;
BADEND:
	if (l_png_writer != NULL) {
		png_destroy_write_struct(&l_png_writer, &l_png_info);
	}
	if ((l_output != NULL) && (l_output != stdout)) {
		fclose(l_output);
		if (result != 0) {
			(void)remove(parameters->output_file);
		}
	}
	l_buffer_cache = l_buffer;
	if (l_buffer_cache != NULL) {
		parameters->free ? parameters->free(NULL, l_buffer_cache) : free(l_buffer_cache);
		l_buffer = NULL;
	}
	return result;
}